

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::FboStateQueryTests::init(FboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *context;
  int extraout_EAX;
  undefined8 in_RAX;
  ApiCase *pAVar2;
  long *plVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  allocator<char> local_75;
  uint local_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  lVar6 = 0;
  do {
    local_74 = (uint)uVar4;
    pAVar2 = (ApiCase *)operator_new(0xa0);
    context = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(&PTR_anon_var_dwarf_8d7d98_00d0a910)[lVar6 * 2],&local_75);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar1 = (&DAT_00d0a918)[lVar6 * 4];
    ApiCase::ApiCase(pAVar2,context,(char *)local_70,"default framebuffer");
    (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d0a958;
    *(undefined4 *)&pAVar2[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar6 = 1;
    uVar4 = 0;
  } while ((local_74 & 1) != 0);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,"framebuffer_attachment_object",
                   "FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0a9b0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_level","FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0aa08;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_cube_map_face",
                   "FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0aa60;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_texture_layer","FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0aab8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_color_encoding","FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ab10;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_component_type","FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ab68;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_x_size_initial","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0abc0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,"framebuffer_attachment_x_size_rbo",
                   "FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ac18;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_attachment_x_size_texture","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ac98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_unspecified_attachment_color_encoding",
                   "FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ad00;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_unspecified_attachment_component_type",
                   "FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ad58;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_unspecified_attachment_x_size_rbo","FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0adb0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar2,(this->super_TestCaseGroup).m_context,
                   "framebuffer_unspecified_attachment_x_size_texture",
                   "FRAMEBUFFER_ATTACHMENT_x_SIZE");
  (pAVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00d0ae30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  return extraout_EAX;
}

Assistant:

void FboStateQueryTests::init (void)
{
	const struct FramebufferTarget
	{
		const char*	name;
		GLenum		target;
	} fboTargets[] =
	{
		{ "draw_framebuffer_", GL_DRAW_FRAMEBUFFER },
		{ "read_framebuffer_", GL_READ_FRAMEBUFFER }
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fboTargets); ++ndx)
		addChild(new DefaultFramebufferCase(m_context, (std::string(fboTargets[ndx].name) + "default_framebuffer").c_str(), "default framebuffer", fboTargets[ndx].target));

	addChild(new AttachmentObjectCase							(m_context, "framebuffer_attachment_object",							"FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME"));
	addChild(new AttachmentTextureLevelCase						(m_context, "framebuffer_attachment_texture_level",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL"));
	addChild(new AttachmentTextureCubeMapFaceCase				(m_context, "framebuffer_attachment_texture_cube_map_face",				"FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE"));
	addChild(new AttachmentTextureLayerCase						(m_context, "framebuffer_attachment_texture_layer",						"FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER"));
	addChild(new AttachmentTextureColorCodingCase				(m_context, "framebuffer_attachment_color_encoding",					"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new AttachmentTextureComponentTypeCase				(m_context, "framebuffer_attachment_component_type",					"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new AttachmentSizeInitialCase						(m_context, "framebuffer_attachment_x_size_initial",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeRboCase							(m_context, "framebuffer_attachment_x_size_rbo",						"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new AttachmentSizeTextureCase						(m_context, "framebuffer_attachment_x_size_texture",					"FRAMEBUFFER_ATTACHMENT_x_SIZE"));

	addChild(new UnspecifiedAttachmentTextureColorCodingCase	(m_context, "framebuffer_unspecified_attachment_color_encoding",		"FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"));
	addChild(new UnspecifiedAttachmentTextureComponentTypeCase	(m_context, "framebuffer_unspecified_attachment_component_type",		"FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE"));
	addChild(new UnspecifiedAttachmentSizeRboCase				(m_context, "framebuffer_unspecified_attachment_x_size_rbo",			"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
	addChild(new UnspecifiedAttachmentSizeTextureCase			(m_context, "framebuffer_unspecified_attachment_x_size_texture",		"FRAMEBUFFER_ATTACHMENT_x_SIZE"));
}